

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxPrinter.cpp
# Opt level: O0

void __thiscall
slang::syntax::SyntaxPrinter::SyntaxPrinter(SyntaxPrinter *this,SourceManager *sourceManager)

{
  undefined8 in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  
  std::__cxx11::string::string(unaff_retaddr);
  *(undefined8 *)(in_RDI + 0x20) = in_RSI;
  *(undefined1 *)(in_RDI + 0x28) = 1;
  *(undefined1 *)(in_RDI + 0x29) = 0;
  *(undefined1 *)(in_RDI + 0x2a) = 0;
  *(undefined1 *)(in_RDI + 0x2b) = 0;
  *(undefined1 *)(in_RDI + 0x2c) = 1;
  *(undefined1 *)(in_RDI + 0x2d) = 1;
  *(undefined1 *)(in_RDI + 0x2e) = 1;
  return;
}

Assistant:

SyntaxPrinter::SyntaxPrinter(const SourceManager& sourceManager) : sourceManager(&sourceManager) {
}